

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

void __thiscall
Simple::Lib::ProtoSignal<bool_(),_Simple::CollectorWhile0<bool>_>::SignalLink::~SignalLink
          (SignalLink *this)

{
  SignalLink *this_local;
  
  if (this->ref_count == 0) {
    std::function<bool_()>::~function(&this->function);
    return;
  }
  __assert_fail("ref_count == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/billyquith[P]SimpleSignal/SimpleSignal.h"
                ,0x50,
                "Simple::Lib::ProtoSignal<bool (), Simple::CollectorWhile0<bool>>::SignalLink::~SignalLink()"
               );
}

Assistant:

void        incref     () { ref_count += 1; assert (ref_count > 0); }